

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_ycbcr_conversion
          (Impl *this,VkSamplerYcbcrConversionCreateInfo *create_info,ScratchAllocator *alloc,
          VkSamplerYcbcrConversionCreateInfo **out_info)

{
  VkSamplerYcbcrConversionCreateInfo *pVVar1;
  bool bVar2;
  VkSamplerYcbcrConversionCreateInfo *info;
  VkSamplerYcbcrConversionCreateInfo **out_info_local;
  ScratchAllocator *alloc_local;
  VkSamplerYcbcrConversionCreateInfo *create_info_local;
  Impl *this_local;
  
  pVVar1 = copy<VkSamplerYcbcrConversionCreateInfo>(this,create_info,1,alloc);
  bVar2 = create_info->pNext == (void *)0x0;
  if (bVar2) {
    *out_info = pVVar1;
  }
  return bVar2;
}

Assistant:

bool StateRecorder::Impl::copy_ycbcr_conversion(const VkSamplerYcbcrConversionCreateInfo *create_info,
                                                ScratchAllocator &alloc, VkSamplerYcbcrConversionCreateInfo **out_info)
{
	auto *info = copy(create_info, 1, alloc);

	// Don't support pNext in this struct.
	if (create_info->pNext)
		return false;

	*out_info = info;
	return true;
}